

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

int lj_cf_debug_gethook(lua_State *L)

{
  TValue *pTVar1;
  lua_State *plVar2;
  int iVar3;
  lua_Hook p_Var4;
  char *str;
  lua_Hook hook;
  char local_15;
  int mask;
  lua_State *plStack_10;
  char buff [5];
  lua_State *L_local;
  
  plStack_10 = L;
  iVar3 = lua_gethookmask(L);
  p_Var4 = lua_gethook(plStack_10);
  if ((p_Var4 == (lua_Hook)0x0) || (p_Var4 == hookf)) {
    pTVar1 = plStack_10->top;
    plStack_10->top = pTVar1 + 1;
    pTVar1->n = -5.13828271674896e-322;
    lua_rawget(plStack_10,-10000);
  }
  else {
    lua_pushlstring(plStack_10,"external hook",0xd);
  }
  plVar2 = plStack_10;
  str = unmakemask(iVar3,&local_15);
  lua_pushstring(plVar2,str);
  plVar2 = plStack_10;
  iVar3 = lua_gethookcount(plStack_10);
  lua_pushinteger(plVar2,(long)iVar3);
  return 3;
}

Assistant:

LJLIB_CF(debug_gethook)
{
  char buff[5];
  int mask = lua_gethookmask(L);
  lua_Hook hook = lua_gethook(L);
  if (hook != NULL && hook != hookf) {  /* external hook? */
    lua_pushliteral(L, "external hook");
  } else {
    (L->top++)->u64 = KEY_HOOK;
    lua_rawget(L, LUA_REGISTRYINDEX);   /* get hook */
  }
  lua_pushstring(L, unmakemask(mask, buff));
  lua_pushinteger(L, lua_gethookcount(L));
  return 3;
}